

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O0

void __thiscall
Superstep<int>::workerFunction
          (Superstep<int> *this,int index,vector<int,_std::allocator<int>_> *inputItems,
          vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *outputItems)

{
  bool bVar1;
  __int_type _Var2;
  size_type sVar3;
  size_type sVar4;
  LockableVector<int> *this_00;
  iterator __i;
  iterator iVar5;
  iterator __position;
  reference piVar6;
  reference this_01;
  reference piVar7;
  _List_node_base *in_RCX;
  int in_ESI;
  long in_RDI;
  logic_error *e;
  int i;
  iterator __end0;
  iterator __begin0;
  value_type *__range6;
  value_type *targetProtocol;
  shared_ptr<LockedVector<int>_> targetV;
  iterator it;
  int vectorOffset;
  int idx;
  list<int,_std::allocator<int>_> remainingActivities;
  unique_lock<std::mutex> lock;
  CommunicationProtocols protocols;
  _List_iterator<int> in_stack_fffffffffffffe78;
  _List_iterator<int> in_stack_fffffffffffffe80;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe88;
  function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *in_stack_fffffffffffffe90;
  function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
  *in_stack_fffffffffffffe98;
  allocator_type *in_stack_fffffffffffffea0;
  Barrier *in_stack_fffffffffffffeb0;
  iterator local_108;
  _List_const_iterator<int> local_100;
  int local_f4;
  int *local_f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  reference local_e0;
  reference local_d8;
  _List_node_base *local_c0;
  iterator local_b8;
  _List_const_iterator<int> local_b0;
  _Self local_a8;
  _Self local_a0;
  undefined4 local_94;
  _List_node_base *local_90;
  _List_node_base *local_88;
  int local_80;
  undefined1 local_79 [65];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_38;
  _List_node_base *local_20;
  int local_c;
  
  local_20 = in_RCX;
  local_c = in_ESI;
  Barrier::waitForFinish(in_stack_fffffffffffffeb0);
  std::
  vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ::operator[]((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                *)(in_RDI + 8),(long)local_c);
  std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>::operator()
            (in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_node);
  Barrier::decreaseBarrier(in_stack_fffffffffffffeb0);
  std::
  vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ::operator[]((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                *)(in_RDI + 8),(long)local_c);
  local_79._57_8_ =
       std::ref<std::vector<int,std::allocator<int>>>
                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78._M_node);
  std::reference_wrapper::operator_cast_to_vector_
            ((reference_wrapper<std::vector<int,_std::allocator<int>_>_> *)0x115076);
  std::
  function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
  ::operator()(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
               in_stack_fffffffffffffe88);
  sVar3 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(&local_38);
  if (sVar3 != 0) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffe80._M_node,
               (mutex_type *)in_stack_fffffffffffffe78._M_node);
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&local_38);
    sVar4 = std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::size
                      ((vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)
                       local_20);
    if (sVar4 < sVar3) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::size(&local_38);
      std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::resize
                ((vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)
                 in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffe80._M_node);
    this_00 = (LockableVector<int> *)
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&local_38);
    in_stack_fffffffffffffeb0 = (Barrier *)local_79;
    std::allocator<int>::allocator((allocator<int> *)0x115188);
    std::__cxx11::list<int,_std::allocator<int>_>::list
              ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,(size_type)this_00,
               in_stack_fffffffffffffea0);
    std::allocator<int>::~allocator((allocator<int> *)0x1151ae);
    local_80 = 0;
    __i = std::begin<std::__cxx11::list<int,std::allocator<int>>>(in_stack_fffffffffffffe78._M_node)
    ;
    local_88 = __i._M_node;
    iVar5 = std::end<std::__cxx11::list<int,std::allocator<int>>>(in_stack_fffffffffffffe78._M_node)
    ;
    local_80 = local_80 + 1;
    local_90 = iVar5._M_node;
    std::iota<std::_List_iterator<int>,int>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0);
    _Var2 = std::__atomic_base<int>::operator++(&nextVectorToLock.super___atomic_base<int>,0);
    in_stack_fffffffffffffe90 =
         (function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *)(long)_Var2;
    sVar3 = std::__cxx11::list<int,_std::allocator<int>_>::size
                      ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_node);
    local_94 = (undefined4)((ulong)in_stack_fffffffffffffe90 % sVar3);
    while (sVar3 = std::__cxx11::list<int,_std::allocator<int>_>::size
                             ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_node),
          sVar3 != 0) {
      __position = std::begin<std::__cxx11::list<int,std::allocator<int>>>
                             (in_stack_fffffffffffffe78._M_node);
      local_a0._M_node = __position._M_node;
      std::advance<std::_List_iterator<int>,int>
                ((_List_iterator<int> *)__i._M_node,(int)((ulong)iVar5._M_node >> 0x20));
      while( true ) {
        local_a8._M_node =
             (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::end(in_stack_fffffffffffffe78._M_node);
        bVar1 = std::operator!=(&local_a0,&local_a8);
        if (!bVar1) break;
        piVar6 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1152ec);
        this_01 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&local_38,(long)*piVar6);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(this_01);
        if (sVar3 == 0) {
          local_b8._M_node = (_List_node_base *)std::_List_iterator<int>::operator++(&local_a0,0);
          std::_List_const_iterator<int>::_List_const_iterator(&local_b0,&local_b8);
          local_c0 = (_List_node_base *)
                     std::__cxx11::list<int,_std::allocator<int>_>::erase
                               (in_stack_fffffffffffffe80._M_node,__position._M_node);
        }
        else {
          in_stack_fffffffffffffe80._M_node = local_20;
          piVar6 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1153b5);
          std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::operator[]
                    ((vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)
                     in_stack_fffffffffffffe80._M_node,(long)*piVar6);
          LockableVector<int>::tryLockAndGet(this_00);
          piVar6 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1153e1);
          local_e0 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&local_38,(long)*piVar6);
          local_d8 = local_e0;
          local_e8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffe78._M_node);
          local_f0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                      ((vector<int,_std::allocator<int>_> *)
                                       in_stack_fffffffffffffe78._M_node);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffe80._M_node,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffe78._M_node), bVar1) {
            piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_e8);
            local_f4 = *piVar7;
            std::__shared_ptr_access<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x115474);
            std::vector<int,std::allocator<int>>::emplace_back<int&>
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                       (int *)__position._M_node);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_e8);
          }
          local_108._M_node = (_List_node_base *)std::_List_iterator<int>::operator++(&local_a0,0);
          std::_List_const_iterator<int>::_List_const_iterator(&local_100,&local_108);
          std::__cxx11::list<int,_std::allocator<int>_>::erase
                    ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_node,
                     (const_iterator)__position._M_node);
          std::shared_ptr<LockedVector<int>_>::~shared_ptr
                    ((shared_ptr<LockedVector<int>_> *)0x115567);
        }
      }
      local_94 = 0;
    }
    std::__cxx11::list<int,_std::allocator<int>_>::~list
              ((list<int,_std::allocator<int>_> *)0x11558b);
  }
  std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::shrink_to_fit
            ((vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)0x1155a9);
  Barrier::decreaseBarrier(in_stack_fffffffffffffeb0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void Superstep<T>::workerFunction (int index, std::vector<T> &inputItems, std::vector<LockableVector<T>> &outputItems) {
	startBarrier.waitForFinish ();


	
	// ============================
	// Performing computation phase
	activitiesFunctions[index].first (index, inputItems);
	compPhaseBarrier.decreaseBarrier ();



	// ==============================
	// Performing communication phase
	// Computing vector which defines the communication phase
	CommunicationProtocols protocols	= activitiesFunctions[index].second (index, std::ref(inputItems));

	if (protocols.size() != 0) {
		// Checking if a resize of outputvectors is needed
		{
			std::unique_lock<std::mutex> lock (outputVectorsMutex);
			
			if (protocols.size() > outputItems.size()) {
				outputItems.resize (protocols.size ());
			}
		}

		std::list<int> remainingActivities (protocols.size());
		int idx	= 0;
		std::iota (std::begin(remainingActivities), std::end(remainingActivities), idx++);


		int vectorOffset	= (nextVectorToLock++) % remainingActivities.size();
		while (remainingActivities.size() > 0) {
			auto it	= std::begin (remainingActivities);
			std::advance (it, vectorOffset);

			while (it!=remainingActivities.end()) {

				if (protocols[*it].size() == 0) {
					remainingActivities.erase (it++);
				}
				else {
					try {
						std::shared_ptr<LockedVector<T>> targetV	= outputItems[*it].tryLockAndGet();
						auto &targetProtocol						= protocols[*it];
						
						// Inserting data at the end of target vector
						for (auto i : targetProtocol) {
							targetV->data.emplace_back (i);
						}

						remainingActivities.erase (it++);
					} catch (std::logic_error &e) {
						it++;
					}
				}
			}
			vectorOffset	= 0;
		}
	}

	outputItems.shrink_to_fit ();

	commPhaseBarrier.decreaseBarrier ();
}